

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.h
# Opt level: O3

void __thiscall
NimState::
do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
          (NimState *this,
          mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          *engine)

{
  result_type_conflict move;
  uniform_int_distribution<int> moves;
  param_type local_18;
  
  if (0 < *(int *)(this + 4)) {
    check_invariant(this);
    local_18._M_b = 3;
    if (*(int *)(this + 4) < 3) {
      local_18._M_b = *(int *)(this + 4);
    }
    local_18._M_a = 1;
    move = std::uniform_int_distribution<int>::operator()
                     ((uniform_int_distribution<int> *)&local_18,engine,&local_18);
    do_move(this,move);
    check_invariant(this);
    return;
  }
  MCTS::assertion_failed
            ("chips > 0",
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/nim.h"
             ,0x23);
}

Assistant:

void do_random_move(RandomEngine* engine)
	{
		attest(chips > 0);
		check_invariant();

		int max = std::min(3, chips);
		std::uniform_int_distribution<Move> moves(1, max);
		do_move(moves(*engine));

		check_invariant();
	}